

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_divuw_m68k(CPUM68KState_conflict *env,int destr,uint32_t den)

{
  uint uVar1;
  uint value;
  uint32_t uVar2;
  uintptr_t unaff_retaddr;
  uint32_t rem;
  uint32_t quot;
  uint32_t num;
  uint32_t den_local;
  int destr_local;
  CPUM68KState_conflict *env_local;
  
  uVar1 = env->dregs[destr];
  if (den == 0) {
    raise_exception_ra(env,5,unaff_retaddr);
  }
  value = uVar1 / den;
  env->cc_c = 0;
  if (value < 0x10000) {
    uVar2 = deposit32(value,0x10,0x10,uVar1 % den);
    env->dregs[destr] = uVar2;
    env->cc_z = (int)(short)value;
    env->cc_n = (int)(short)value;
    env->cc_v = 0;
  }
  else {
    env->cc_v = 0xffffffff;
    env->cc_z = 1;
  }
  return;
}

Assistant:

void HELPER(divuw)(CPUM68KState *env, int destr, uint32_t den)
{
    uint32_t num = env->dregs[destr];
    uint32_t quot, rem;

    if (den == 0) {
        raise_exception_ra(env, EXCP_DIV0, GETPC());
    }
    quot = num / den;
    rem = num % den;

    env->cc_c = 0; /* always cleared, even if overflow */
    if (quot > 0xffff) {
        env->cc_v = -1;
        /*
         * real 68040 keeps N and unset Z on overflow,
         * whereas documentation says "undefined"
         */
        env->cc_z = 1;
        return;
    }
    env->dregs[destr] = deposit32(quot, 16, 16, rem);
    env->cc_z = (int16_t)quot;
    env->cc_n = (int16_t)quot;
    env->cc_v = 0;
}